

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O2

void __thiscall SPTest_OrderConsByStage_Test::TestBody(SPTest_OrderConsByStage_Test *this)

{
  int iVar1;
  pointer piVar2;
  SuffixHandler<int> SVar3;
  ColProblem *pCVar4;
  char *pcVar5;
  StringRef name;
  LinearConHandler LVar6;
  AssertHelper local_738;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_730;
  AssertionResult gtest_ar;
  SPAdapter sp;
  TestProblem p;
  NLHeader header;
  
  MakeHeader(&header,1,0);
  header.super_NLProblemInfo.super_NLProblemInfo_C.num_con_nonzeros = 1;
  TestProblem::TestProblem(&p,&header);
  name.size_ = 5;
  name.data_ = "stage";
  SVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddSuffix<int>
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)&p,name,0);
  **(undefined4 **)((long)SVar3.suffix_.super_BasicSuffix<int>.super_SuffixBase.impl_ + 0x18) = 2;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
            ((BasicProblem<mp::BasicProblemParams<int>_> *)&p,0.0,7.0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
            ((BasicProblem<mp::BasicProblemParams<int>_> *)&p,0.0,11.0);
  sp.problem_ = p.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_;
  mp::ColProblemBuilder::ColumnSizeHandler::Add((ColumnSizeHandler *)&sp,1);
  LVar6 = TestProblem::OnLinearConExpr(&p,0);
  pCVar4 = LVar6.problem_;
  piVar2 = (pCVar4->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar2[1];
  piVar2[1] = iVar1 + 1;
  (pCVar4->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[iVar1] = LVar6.con_index_;
  (pCVar4->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iVar1] = 1.0;
  mp::SPAdapter::SPAdapter(&sp,&p.super_ColProblem);
  local_738.data_._0_4_ = 0xb;
  local_730.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((sp.problem_)->super_Problem).algebraic_cons_.
       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
       ._M_impl.super__Vector_impl_data._M_start
       [*sp.con_core2orig_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start].ub;
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&gtest_ar,"11","sp.con(0).ub()",(int *)&local_738,(double *)&local_730);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_730);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_738,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x221,
               pcVar5);
    testing::internal::AssertHelper::operator=(&local_738,(Message *)&local_730);
    testing::internal::AssertHelper::~AssertHelper(&local_738);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_730);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_738.data_._0_4_ = 7;
  local_730.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((sp.problem_)->super_Problem).algebraic_cons_.
       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
       ._M_impl.super__Vector_impl_data._M_start
       [sp.con_core2orig_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[1]].ub;
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&gtest_ar,"7","sp.con(1).ub()",(int *)&local_738,(double *)&local_730);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_730);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_738,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x222,
               pcVar5);
    testing::internal::AssertHelper::operator=(&local_738,(Message *)&local_730);
    testing::internal::AssertHelper::~AssertHelper(&local_738);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_730);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::SPAdapter::~SPAdapter(&sp);
  mp::ColProblem::~ColProblem(&p.super_ColProblem);
  return;
}

Assistant:

TEST(SPTest, OrderConsByStage) {
  auto header = MakeHeader(1);
  header.num_con_nonzeros = 1;
  TestProblem p(header);
  auto stage = p.AddIntSuffix("stage", mp::suf::VAR, 1);
  stage.SetValue(0, 2);
  p.AddCon(0, 7);
  p.AddCon(0, 11);
  p.OnColumnSizes().Add(1);
  auto expr = p.OnLinearConExpr(0);
  expr.AddTerm(0, 1);
  mp::SPAdapter sp(p);
  EXPECT_EQ(11, sp.con(0).ub());
  EXPECT_EQ( 7, sp.con(1).ub());
}